

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<char>::basic_format
          (basic_format<char> *this,string_type *format_string)

{
  formattible<char> *pfVar1;
  string *in_RSI;
  long in_RDI;
  basic_message<char> *in_stack_ffffffffffffffb0;
  formattible<char> *local_48;
  
  basic_message<char>::basic_message(in_stack_ffffffffffffffb0);
  std::__cxx11::string::string((string *)(in_RDI + 0x80),in_RSI);
  *(undefined1 *)(in_RDI + 0xa0) = 0;
  local_48 = (formattible<char> *)(in_RDI + 0xa8);
  pfVar1 = (formattible<char> *)(in_RDI + 0x128);
  do {
    details::formattible<char>::formattible(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != pfVar1);
  *(undefined4 *)(in_RDI + 0x128) = 0;
  std::
  vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
  ::vector((vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
            *)0x14240c);
  return;
}

Assistant:

basic_format(string_type format_string) : 
                format_(format_string),
                translate_(false),
                parameters_count_(0)
            {
            }